

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVclient_force_shutdown(EVclient client,int result)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  uint in_ESI;
  long *in_RDI;
  timespec ts_2;
  timespec ts_1;
  EVshutdown_contribution_msg msg;
  CMFormat shutdown_msg;
  timespec ts;
  CMConnection in_stack_000001d0;
  int in_stack_000001dc;
  EVmaster in_stack_000001e0;
  CMConnection in_stack_ffffffffffffff78;
  FILE *pFVar5;
  CManager_conflict in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  char *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  __time_t local_50;
  undefined4 local_48;
  CMTraceType in_stack_ffffffffffffffbc;
  CManager in_stack_ffffffffffffffc0;
  long local_38;
  timespec local_20;
  uint local_c;
  long *local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_c = in_ESI | 0x10000;
  local_8 = in_RDI;
  if ((int)in_RDI[8] != 0) {
    printf("Node %d, already contributed to shutdown.  Don\'t call shutdown twice!\n",
           (ulong)*(uint *)(in_RDI + 6));
  }
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(*local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffffa0 = *(CManager *)(*local_8 + 0x120);
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffffa0,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_20);
      fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_20.tv_sec,local_20.tv_nsec);
    }
    fprintf(*(FILE **)(*local_8 + 0x120),"Client %d calling client_FORCE_shutdown\n",
            (ulong)*(uint *)(local_8 + 6));
  }
  fflush(*(FILE **)(*local_8 + 0x120));
  if (local_8[4] == 0) {
    possibly_signal_shutdown(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0);
  }
  else {
    INT_CMlookup_format((CManager)*local_8,EVclient_shutdown_contribution_format_list);
    INT_CMwrite((CMConnection)in_stack_ffffffffffffff80,(CMFormat)in_stack_ffffffffffffff78,
                (void *)0x15efdc);
  }
  if ((int)local_8[8] == 0) {
    IntCManager_unlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(*local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(*local_8 + 0x120);
        _Var2 = getpid();
        in_stack_ffffffffffffff98 = (char *)(long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",in_stack_ffffffffffffff98,pVar4);
        line = (int)((ulong)pFVar5 >> 0x20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffffc0);
        fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffc0,local_38);
      }
      fprintf(*(FILE **)(*local_8 + 0x120),"Client %d shutdown condition wait\n",
              (ulong)*(uint *)(local_8 + 6));
    }
    fflush(*(FILE **)(*local_8 + 0x120));
    new_shutdown_condition((EVclient)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    CMCondition_wait(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(*local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(*local_8 + 0x120);
        _Var2 = getpid();
        lVar3 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_50);
        fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_50,
                CONCAT44(in_stack_ffffffffffffffbc,local_48));
      }
      fprintf(*(FILE **)(*local_8 + 0x120),"Client %d shutdown condition wait DONE!\n",
              (ulong)*(uint *)(local_8 + 6));
    }
    fflush(*(FILE **)(*local_8 + 0x120));
    IntCManager_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
  }
  return (int)local_8[3];
}

Assistant:

extern int
INT_EVclient_force_shutdown(EVclient client, int result)
{
    result |= STATUS_FORCE;
    if (client->already_shutdown) printf("Node %d, already contributed to shutdown.  Don't call shutdown twice!\n", client->my_node_id);
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d calling client_FORCE_shutdown\n", client->my_node_id);
    if (client->master_connection != NULL) {
	/* we are a client, tell the master to shutdown */
	CMFormat shutdown_msg = INT_CMlookup_format(client->cm, EVclient_shutdown_contribution_format_list);
	EVshutdown_contribution_msg msg;
	msg.value = result;
	INT_CMwrite(client->master_connection, shutdown_msg, &msg);
	/* and wait until we hear back */
    } else {
	possibly_signal_shutdown(client->master, result, NULL);
    }
    if (!client->already_shutdown) {
	CManager_unlock(client->cm);
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait\n", client->my_node_id);
	CMCondition_wait(client->cm, new_shutdown_condition(client, client->master_connection));
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait DONE!\n", client->my_node_id);
	CManager_lock(client->cm);
    }
    return client->shutdown_value;
}